

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectPoller.cpp
# Opt level: O2

int __thiscall
sznet::net::SelectPoller::poll(SelectPoller *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  __fd_mask *p_Var1;
  int iVar2;
  uint uVar3;
  pointer pEVar4;
  int iVar5;
  int extraout_EAX;
  int extraout_EAX_00;
  long lVar6;
  ulong uVar7;
  LogStream *this_00;
  iterator __begin2;
  pointer pEVar8;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  Logger local_1060;
  undefined1 local_90 [12];
  undefined1 local_80 [8];
  timeval timeout;
  undefined4 local_68;
  undefined1 local_60 [12];
  undefined1 local_50 [12];
  pollfd *local_40;
  int local_34;
  
  pEVar8 = (this->m_pollfds).
           super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar4 = (this->m_pollfds).
           super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar8 == pEVar4) {
    if (0 < g_logLevel) {
      return 0x15a424;
    }
    Logger::SourceFile::SourceFile<103>
              ((SourceFile *)local_90,
               (char (*) [103])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data = (char *)local_90._0_8_;
    file_00.m_size = local_90._8_4_;
    Logger::Logger(&local_1060,file_00,0x1a,TRACE,"poll");
    LogStream::operator<<(&local_1060.m_impl.m_stream,"m_pollfds is empty, nothing happened");
  }
  else {
    local_34 = (int)__nfds;
    for (lVar6 = 0xb; lVar6 != 0x1b; lVar6 = lVar6 + 1) {
      (this->m_rfds).fds_bits[lVar6 + -0xb] = 0;
    }
    for (lVar6 = 0x1b; lVar6 != 0x2b; lVar6 = lVar6 + 1) {
      (this->m_rfds).fds_bits[lVar6 + -0xb] = 0;
    }
    for (lVar6 = 0x2b; lVar6 != 0x3b; lVar6 = lVar6 + 1) {
      (this->m_rfds).fds_bits[lVar6 + -0xb] = 0;
    }
    iVar5 = 0;
    for (; pEVar8 != pEVar4; pEVar8 = pEVar8 + 1) {
      iVar2 = pEVar8->fd;
      uVar3 = pEVar8->ev;
      if ((uVar3 & 1) != 0) {
        p_Var1 = (this->m_rfds).fds_bits + iVar2 / 0x40;
        *p_Var1 = *p_Var1 | 1L << ((ulong)(uint)(iVar2 % 0x40) & 0x3f);
      }
      uVar7 = 1L << ((ulong)(uint)(iVar2 % 0x40) & 0x3f);
      if ((uVar3 & 8) != 0) {
        p_Var1 = (this->m_wfds).fds_bits + iVar2 / 0x40;
        *p_Var1 = *p_Var1 | uVar7;
      }
      p_Var1 = (this->m_efds).fds_bits + iVar2 / 0x40;
      *p_Var1 = *p_Var1 | uVar7;
      if (iVar5 < iVar2) {
        iVar5 = iVar2;
      }
    }
    local_80 = (undefined1  [8])(long)(local_34 / 1000);
    timeout.tv_sec = (__time_t)((local_34 % 1000) * 1000);
    local_40 = __fds;
    iVar5 = select(iVar5 + 1,(fd_set *)&this->m_rfds,(fd_set *)&this->m_wfds,(fd_set *)&this->m_efds
                   ,(timeval *)local_80);
    if (0 < iVar5) {
      if (g_logLevel < 1) {
        Logger::SourceFile::SourceFile<103>
                  ((SourceFile *)&timeout.tv_usec,
                   (char (*) [103])
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                  );
        file._12_4_ = 0;
        file.m_data = (char *)timeout.tv_usec;
        file.m_size = local_68;
        Logger::Logger(&local_1060,file,0x3e,TRACE,"poll");
        this_00 = LogStream::operator<<(&local_1060.m_impl.m_stream,iVar5);
        LogStream::operator<<(this_00," events happened");
        Logger::~Logger(&local_1060);
      }
      fillActiveChannels(this,iVar5,(ChannelList *)local_40);
      return extraout_EAX;
    }
    if (iVar5 == 0) {
      if (0 < g_logLevel) {
        return 0x15a424;
      }
      Logger::SourceFile::SourceFile<103>
                ((SourceFile *)local_60,
                 (char (*) [103])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                );
      file_02._12_4_ = 0;
      file_02.m_data = (char *)local_60._0_8_;
      file_02.m_size = local_60._8_4_;
      Logger::Logger(&local_1060,file_02,0x43,TRACE,"poll");
      LogStream::operator<<(&local_1060.m_impl.m_stream,"nothing happened");
    }
    else {
      iVar5 = sz_getlasterr();
      if (iVar5 == 4) {
        return 4;
      }
      Logger::SourceFile::SourceFile<103>
                ((SourceFile *)local_50,
                 (char (*) [103])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                );
      file_01._12_4_ = 0;
      file_01.m_data = (char *)local_50._0_8_;
      file_01.m_size = local_50._8_4_;
      Logger::Logger(&local_1060,file_01,0x49,false);
      LogStream::operator<<(&local_1060.m_impl.m_stream,"SelectPoller::poll()");
    }
  }
  Logger::~Logger(&local_1060);
  return extraout_EAX_00;
}

Assistant:

void SelectPoller::poll(ChannelList* activeChannels, int timeoutMs)
{
	if (m_pollfds.empty())
	{
		LOG_TRACE << "m_pollfds is empty, nothing happened";
		return;
	}

	FD_ZERO(&m_rfds);
	FD_ZERO(&m_wfds);
	FD_ZERO(&m_efds);
	sockets::sz_fd maxfd = 0;
	for (const auto& elem : m_pollfds)
	{
		if (elem.ev & Channel::kNoneEvent)
		{
			continue;
		}
		if (elem.ev & Channel::kReadEvent)
		{
			FD_SET(elem.fd, &m_rfds);
		}
		if (elem.ev & Channel::kWriteEvent)
		{
			FD_SET(elem.fd, &m_wfds);
		}
		FD_SET(elem.fd, &m_efds);
		if (elem.fd > maxfd)
		{
			maxfd = elem.fd;
		}
	}

	timeval timeout;
	timeout.tv_sec = timeoutMs / 1000;
	timeout.tv_usec = static_cast<int>(timeoutMs % 1000) * 1000;
	int numEvents = select(static_cast<int>(maxfd + 1), &m_rfds, &m_wfds, &m_efds, &timeout);

	if (numEvents > 0)
	{
		LOG_TRACE << numEvents << " events happened";
		fillActiveChannels(numEvents, activeChannels);
	}
	else if (numEvents == 0)
	{
		LOG_TRACE << "nothing happened";
	}
	else
	{
		if (sz_getlasterr() != sz_err_eintr)
		{
			LOG_SYSERR << "SelectPoller::poll()";
		}
	}
	return;
}